

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

bool __thiscall cmParseJacocoCoverage::XMLParser::FindPackagePath(XMLParser *this,string *fileName)

{
  uint uVar1;
  string *fileName_local;
  XMLParser *this_local;
  
  uVar1 = (*(this->super_cmXMLParser)._vptr_cmXMLParser[0xf])
                    (this,fileName,&this->Coverage->SourceDir);
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(this->super_cmXMLParser)._vptr_cmXMLParser[0xf])
                      (this,fileName,&this->Coverage->BinaryDir);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool FindPackagePath(std::string const& fileName)
  {
    // Search for the source file in the source directory.
    if (this->PackagePathFound(fileName, this->Coverage.SourceDir)) {
      return true;
    }

    // If not found there, check the binary directory.
    if (this->PackagePathFound(fileName, this->Coverage.BinaryDir)) {
      return true;
    }
    return false;
  }